

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state_machine.h
# Opt level: O0

process_status __thiscall
state_machine::state_machine::
StateMachine<state_machine::transition::Table<state_machine::transition::Row<state_machine::transition::Transition<state_machine::transition::State<(anonymous_namespace)::s1>,state_machine::transition::Event<(anonymous_namespace)::e2>,state_machine::transition::detail::guard_always,(anonymous_namespace)::return_s2,state_machine::transition::State<(anonymous_namespace)::s2>>,state_machine::transition::Transition<state_machine::transition::State<(anonymous_namespace)::s1>,state_machine::transition::Event<(anonymous_namespace)::e2>,state_machine::transition::detail::guard_always,(anonymous_namespace)::return_s3<3>,state_machine::transition::State<(anonymous_namespace)::s3>>>,state_machine::transition::Row<state_machine::transition::Transition<state_machine::transition::State<(anonymous_namespace)::s1>,state_machine::transition::Event<(anonymous_namespace)::e1>,state_machine::transition::detail::guard_always,state_machine::transition::detail::action_pass,state_machine::transition::State<void>>>,state_machine::transition::Row<state_machine::transition::Transition<state_machine::transition::State<(anonymous_namespace)::s1>,state_machine::transition::Event<(anonymous_namespace)::e3>,state_machine::transition::detail::guard_always,(anonymous_namespace)::return_s3_e3,state_machine::transition::State<(anonymous_namespace)::s3>>>,state_machine::transition::Row<state_machine::transition::Transition<state_machine::transition::State<(anonymous_namespace)::s3>,state_machine::transition::Event<(anonymous_namespace)::e3>,(anonymous_namespace)::e3_greater_than<0>,(anonymous_namespace)::return_s2,state_machine::transition::State<(anonymous_namespace)::s2>>,state_machine::transition::Transition<state_machine::transition::State<(anonymous_namespace)::s3>,state_machine::transition::Event<(anonymous_namespace)::e3>,(anonymous_namespace)::e3_less_than<1>,(anonymous_namespace)::return_s3<0>,state_machine::transition::State<(anonymous_namespace)::s3>>>>>
::find_row<(anonymous_namespace)::e3,1ul,2ul,3ul>
          (StateMachine<state_machine::transition::Table<state_machine::transition::Row<state_machine::transition::Transition<state_machine::transition::State<(anonymous_namespace)::s1>,state_machine::transition::Event<(anonymous_namespace)::e2>,state_machine::transition::detail::guard_always,(anonymous_namespace)::return_s2,state_machine::transition::State<(anonymous_namespace)::s2>>,state_machine::transition::Transition<state_machine::transition::State<(anonymous_namespace)::s1>,state_machine::transition::Event<(anonymous_namespace)::e2>,state_machine::transition::detail::guard_always,(anonymous_namespace)::return_s3<3>,state_machine::transition::State<(anonymous_namespace)::s3>>>,state_machine::transition::Row<state_machine::transition::Transition<state_machine::transition::State<(anonymous_namespace)::s1>,state_machine::transition::Event<(anonymous_namespace)::e1>,state_machine::transition::detail::guard_always,state_machine::transition::detail::action_pass,state_machine::transition::State<void>>>,state_machine::transition::Row<state_machine::transition::Transition<state_machine::transition::State<(anonymous_namespace)::s1>,state_machine::transition::Event<(anonymous_namespace)::e3>,state_machine::transition::detail::guard_always,(anonymous_namespace)::return_s3_e3,state_machine::transition::State<(anonymous_namespace)::s3>>>,state_machine::transition::Row<state_machine::transition::Transition<state_machine::transition::State<(anonymous_namespace)::s3>,state_machine::transition::Event<(anonymous_namespace)::e3>,(anonymous_namespace)::e3_greater_than<0>,(anonymous_namespace)::return_s2,state_machine::transition::State<(anonymous_namespace)::s2>>,state_machine::transition::Transition<state_machine::transition::State<(anonymous_namespace)::s3>,state_machine::transition::Event<(anonymous_namespace)::e3>,(anonymous_namespace)::e3_less_than<1>,(anonymous_namespace)::return_s3<0>,state_machine::transition::State<(anonymous_namespace)::s3>>>>>
           *this,char *event,int param_3)

{
  char *pcVar1;
  process_status local_31;
  e3 *event_local;
  StateMachine<_b61f1d36_> *this_local;
  
  pcVar1 = variant::
           Variant<(anonymous_namespace)::s1,_(anonymous_namespace)::s3,_(anonymous_namespace)::s2>
           ::index((Variant<(anonymous_namespace)::s1,_(anonymous_namespace)::s3,_(anonymous_namespace)::s2>
                    *)(this + 8),event,param_3);
  if (((ulong)pcVar1 & 0xff) == 1) {
    local_31 = StateMachine<$b61f1d36$>::
               get_row_transitions<(anonymous_namespace)::e3,_std::integral_constant<unsigned_long,_2UL>,_0>
                         ((StateMachine<_b61f1d36_> *)this,event);
  }
  else {
    local_31 = find_row<(anonymous_namespace)::e3,2ul,3ul>(this,event);
  }
  return local_31;
}

Assistant:

constexpr auto find_row(Event&& event, std::index_sequence<I, Is...>) -> process_status {
        using state_type =
            typename variant_type::alternative_index_map::template at_value<aux::index_constant<I>>;

        using key_type = transition::Key<transition::State<state_type>, transition::Event<Event>>;

        return (state_.index() == I) ?
                   get_row_transitions(std::forward<Event>(event),
                                       typename std::decay_t<Table>::row_index_map::
                                           template at_key<key_type, transition_not_found>{}) :
                   find_row(std::forward<Event>(event), std::index_sequence<Is...>{});
    }